

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

int template_cancreate(t_template *template)

{
  int iVar1;
  int iVar2;
  t_template *template_00;
  t_template *elemtemplate;
  t_dataslot *datatypes;
  int nitems;
  int type;
  int i;
  t_template *template_local;
  
  iVar1 = template->t_n;
  elemtemplate = (t_template *)template->t_vec;
  nitems = 0;
  while( true ) {
    if (iVar1 <= nitems) {
      return 1;
    }
    if ((*(int *)&elemtemplate->t_pdobj == 3) &&
       ((template_00 = template_findbyname(elemtemplate->t_sym), template_00 == (t_template *)0x0 ||
        (iVar2 = template_cancreate(template_00), iVar2 == 0)))) break;
    nitems = nitems + 1;
    elemtemplate = (t_template *)&elemtemplate->t_n;
  }
  pd_error((void *)0x0,"%s: no such template",elemtemplate->t_sym->s_name);
  return 0;
}

Assistant:

static int template_cancreate(t_template *template)
{
    int i, type, nitems = template->t_n;
    t_dataslot *datatypes = template->t_vec;
    t_template *elemtemplate;
    for (i = 0; i < nitems; i++, datatypes++)
        if (datatypes->ds_type == DT_ARRAY &&
            (!(elemtemplate = template_findbyname(datatypes->ds_arraytemplate))
                || !template_cancreate(elemtemplate)))
    {
        pd_error(0, "%s: no such template", datatypes->ds_arraytemplate->s_name);
        return (0);
    }
    return (1);
}